

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_out_prod(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  ggml_type gVar2;
  int iVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  long lVar6;
  ggml_tensor *pgVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  code *pcVar21;
  void *pvVar22;
  void *pvVar23;
  undefined1 auVar24 [16];
  long lVar25;
  size_t sVar26;
  long lVar27;
  float *x_00;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int i;
  long lVar33;
  long lVar34;
  uint *puVar35;
  char *pcVar36;
  int j;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  undefined8 uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  int64_t i11;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  ulong uVar60;
  bool bVar61;
  undefined1 auVar62 [64];
  float in_XMM0_Da;
  float v_00;
  float *v [32];
  float *x [32];
  long local_bf0;
  int local_be0;
  long local_ba8;
  long local_ba0;
  int local_b98;
  long alStack_a80 [64];
  undefined1 auStack_880 [2128];
  
  pgVar5 = dst->src[0];
  gVar2 = pgVar5->type;
  uVar60 = (ulong)gVar2;
  if (uVar60 < 0x24) {
    if ((0xc20ff7dccU >> (uVar60 & 0x3f) & 1) != 0) {
      lVar6 = pgVar5->ne[0];
      pgVar7 = dst->src[1];
      sVar8 = pgVar5->nb[0];
      sVar9 = pgVar5->nb[1];
      lVar58 = pgVar5->ne[2];
      lVar57 = pgVar5->ne[3];
      uVar43 = pgVar5->ne[1];
      lVar27 = pgVar7->ne[3];
      lVar37 = pgVar7->ne[2];
      sVar10 = pgVar5->nb[2];
      sVar11 = pgVar7->nb[1];
      sVar12 = pgVar5->nb[3];
      lVar13 = pgVar7->ne[0];
      sVar14 = pgVar7->nb[3];
      sVar15 = pgVar7->nb[0];
      lVar28 = dst->ne[1];
      sVar16 = pgVar7->nb[2];
      lVar38 = dst->ne[3];
      lVar50 = dst->ne[0];
      sVar17 = dst->nb[1];
      lVar59 = dst->ne[2];
      sVar18 = dst->nb[0];
      sVar19 = dst->nb[2];
      sVar20 = dst->nb[3];
      iVar3 = params->ith;
      iVar4 = params->nth;
      lVar25 = ggml_get_type_traits(uVar60);
      if (lVar58 == lVar37) {
        if (lVar57 == lVar27) {
          if (lVar59 == lVar58) {
            if (lVar38 == lVar57) {
              pcVar21 = *(code **)(lVar25 + 0x28);
              sVar26 = ggml_type_size(gVar2);
              if (sVar8 == sVar26) {
                if (sVar18 == 4) {
                  if (lVar50 == lVar6) {
                    if (lVar28 == lVar13) {
                      lVar58 = lVar58 * lVar13;
                      local_be0 = (int)lVar6;
                      if (iVar3 == 0) {
                        ggml_vec_set_f32((int)lVar58 * (int)lVar57 * local_be0,(float *)dst->data,
                                         v_00);
                      }
                      ggml_barrier(params->threadpool);
                      lVar57 = lVar57 * lVar58;
                      lVar27 = (lVar57 + -1 + (long)iVar4) / (long)iVar4;
                      lVar37 = lVar27 * iVar3;
                      lVar27 = lVar27 + lVar37;
                      if (lVar57 <= lVar27) {
                        lVar27 = lVar57;
                      }
                      x_00 = (float *)((lVar6 + 0x10) * (long)iVar3 * 4 + (long)params->wdata);
                      for (; lVar37 < lVar27; lVar37 = lVar37 + 1) {
                        lVar57 = lVar37 / lVar58;
                        lVar28 = (lVar37 % lVar58) / lVar13;
                        lVar38 = (lVar37 % lVar58) % lVar13;
                        lVar50 = lVar57 * sVar12 + lVar28 * sVar10;
                        local_bf0 = lVar57 * sVar14 + lVar38 * sVar15 + lVar28 * sVar16;
                        uVar60 = ~((long)uVar43 >> 0x3f) & uVar43;
                        while (bVar61 = uVar60 != 0, uVar60 = uVar60 - 1, bVar61) {
                          pvVar22 = dst->data;
                          pvVar23 = pgVar7->data;
                          (*pcVar21)((long)pgVar5->data + lVar50,x_00,lVar6);
                          ggml_vec_mad_f32(local_be0,
                                           (float *)((long)pvVar22 +
                                                    lVar57 * sVar20 + lVar28 * sVar19 +
                                                    lVar38 * sVar17),x_00,
                                           *(float *)((long)pvVar23 + local_bf0));
                          local_bf0 = local_bf0 + sVar11;
                          lVar50 = lVar50 + sVar9;
                        }
                      }
                      return;
                    }
                    pcVar36 = "ne1 == ne10";
                    uVar47 = 0xe94;
                  }
                  else {
                    pcVar36 = "ne0 == ne00";
                    uVar47 = 0xe93;
                  }
                }
                else {
                  pcVar36 = "nb0 == sizeof(float)";
                  uVar47 = 0xe8e;
                }
              }
              else {
                pcVar36 = "nb00 == ggml_type_size(type)";
                uVar47 = 0xe8b;
              }
            }
            else {
              pcVar36 = "ne3 == ne13";
              uVar47 = 0xe88;
            }
          }
          else {
            pcVar36 = "ne2 == ne12";
            uVar47 = 0xe87;
          }
        }
        else {
          pcVar36 = "ne03 == ne13";
          uVar47 = 0xe86;
        }
      }
      else {
        pcVar36 = "ne02 == ne12";
        uVar47 = 0xe85;
      }
LAB_00139173:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                 ,uVar47,"GGML_ASSERT(%s) failed",pcVar36);
    }
    if (uVar60 == 0) {
      if (dst->type == GGML_TYPE_F32) {
        pgVar7 = dst->src[1];
        if (pgVar7->type == GGML_TYPE_F32) {
          if (dst->ne[0] == pgVar5->ne[0]) {
            lVar6 = pgVar7->ne[0];
            if (dst->ne[1] == lVar6) {
              lVar58 = pgVar7->ne[2];
              if (dst->ne[2] == lVar58) {
                lVar57 = pgVar7->ne[3];
                if (dst->ne[3] == lVar57) {
                  lVar27 = pgVar5->ne[2];
                  if (lVar58 % lVar27 == 0) {
                    lVar37 = pgVar5->ne[3];
                    if (lVar57 % lVar37 == 0) {
                      if (pgVar5->nb[0] == 4) {
                        if (dst->nb[0] == 4) {
                          lVar28 = lVar58 * lVar6;
                          iVar3 = params->nth;
                          lVar13 = pgVar5->ne[1];
                          sVar8 = pgVar5->nb[2];
                          sVar9 = pgVar5->nb[1];
                          sVar10 = pgVar5->nb[3];
                          sVar11 = pgVar7->nb[0];
                          sVar12 = pgVar7->nb[1];
                          iVar4 = params->ith;
                          sVar14 = pgVar7->nb[2];
                          sVar15 = pgVar7->nb[3];
                          sVar16 = dst->nb[1];
                          sVar17 = dst->nb[2];
                          sVar18 = dst->nb[3];
                          local_b98 = (int)pgVar5->ne[0];
                          if (iVar4 == 0) {
                            ggml_vec_set_f32((int)lVar57 * local_b98 * (int)lVar28,
                                             (float *)dst->data,in_XMM0_Da);
                          }
                          ggml_barrier(params->threadpool);
                          lVar59 = lVar57 * lVar28;
                          lVar50 = (lVar59 + -1 + (long)iVar3) / (long)iVar3;
                          uVar60 = (ulong)local_b98;
                          lVar38 = iVar4 * lVar50;
                          lVar50 = lVar50 + lVar38;
                          if (lVar59 <= lVar50) {
                            lVar50 = lVar59;
                          }
                          while (lVar59 = lVar38, lVar59 < lVar50) {
                            lVar38 = lVar59 + 0x10;
                            lVar25 = lVar50;
                            if (lVar38 < lVar50) {
                              lVar25 = lVar38;
                            }
                            lVar53 = 0x20;
                            local_ba0 = 0;
                            local_ba8 = 0;
                            lVar54 = 0;
                            while( true ) {
                              lVar55 = lVar53;
                              if (lVar13 < lVar53) {
                                lVar55 = lVar13;
                              }
                              if (lVar13 <= lVar54) break;
                              lVar1 = lVar54 + 0x20;
                              lVar44 = lVar13;
                              if (lVar1 < lVar13) {
                                lVar44 = lVar1;
                              }
                              lVar55 = lVar55 - lVar44 % 0x20;
                              lVar45 = lVar44 - lVar44 % 0x20;
                              for (lVar32 = lVar59; lVar32 < lVar25; lVar32 = lVar32 + 1) {
                                lVar29 = lVar32 / lVar28;
                                lVar30 = (lVar32 % lVar28) / lVar6;
                                lVar39 = (lVar32 % lVar28) % lVar6;
                                lVar40 = lVar39 * sVar11;
                                lVar46 = lVar29 * sVar15;
                                lVar56 = lVar30 * sVar14;
                                lVar39 = lVar39 * sVar16;
                                lVar33 = lVar29 * sVar18;
                                lVar52 = (lVar30 / (lVar58 / lVar27)) * sVar8;
                                lVar30 = lVar30 * sVar17;
                                lVar48 = (lVar29 / (lVar57 / lVar37)) * sVar10;
                                lVar41 = lVar40 + local_ba8 + lVar46 + lVar56;
                                lVar49 = lVar48 + local_ba0 + lVar52;
                                for (lVar29 = lVar54; lVar29 < lVar45; lVar29 = lVar29 + 0x20) {
                                  pvVar22 = dst->data;
                                  lVar31 = (long)pgVar7->data + lVar41;
                                  lVar34 = (long)pgVar5->data + lVar49;
                                  for (lVar42 = 0; lVar42 != 0x20; lVar42 = lVar42 + 1) {
                                    alStack_a80[lVar42 + 0x20] = lVar34;
                                    alStack_a80[lVar42] = lVar31;
                                    lVar31 = lVar31 + (int)sVar12;
                                    lVar34 = lVar34 + (int)sVar9;
                                  }
                                  for (lVar31 = 0; lVar31 != 0x100; lVar31 = lVar31 + 8) {
                                    auVar62 = vbroadcastss_avx512f
                                                        (ZEXT416(**(uint **)((long)alStack_a80 +
                                                                            lVar31)));
                                    *(undefined1 (*) [64])(auStack_880 + lVar31 * 8) = auVar62;
                                  }
                                  for (lVar31 = 0; lVar31 < (long)(uVar60 & 0xffffffffffffffc0);
                                      lVar31 = lVar31 + 0x40) {
                                    lVar34 = lVar31 * 4 + lVar33 + lVar30 + lVar39;
                                    for (lVar42 = 0; lVar42 != 4; lVar42 = lVar42 + 1) {
                                      auVar62 = *(undefined1 (*) [64])
                                                 ((long)pvVar22 + lVar42 * 0x40 + lVar34);
                                      for (lVar51 = 0; lVar51 != 0x100; lVar51 = lVar51 + 8) {
                                        auVar62 = vfmadd231ps_avx512f(auVar62,*(undefined1 (*) [64])
                                                                               (lVar31 * 4 +
                                                                                *(long *)((long)
                                                  alStack_a80 + lVar51 + 0x100) + lVar42 * 0x40),
                                                  *(undefined1 (*) [64])(auStack_880 + lVar51 * 8));
                                      }
                                      *(undefined1 (*) [64])((long)pvVar22 + lVar42 * 0x40 + lVar34)
                                           = auVar62;
                                    }
                                  }
                                  for (lVar31 = 0;
                                      puVar35 = (uint *)((long)pvVar22 +
                                                        lVar39 + lVar33 + lVar30 +
                                                        (uVar60 >> 6) * 0x100),
                                      uVar43 = uVar60 & 0xffffffffffffffc0, lVar31 != 0x20;
                                      lVar31 = lVar31 + 1) {
                                    while ((long)uVar43 < (long)uVar60) {
                                      auVar24 = vfmadd213ss_fma(ZEXT416(*(uint *)alStack_a80[lVar31]
                                                                       ),ZEXT416(*(uint *)(
                                                  alStack_a80[lVar31 + 0x20] + uVar43 * 4)),
                                                  ZEXT416(*puVar35));
                                      *puVar35 = auVar24._0_4_;
                                      puVar35 = puVar35 + 1;
                                      uVar43 = uVar43 + 1;
                                    }
                                  }
                                  lVar49 = lVar49 + sVar9 * 0x20;
                                  lVar41 = lVar41 + sVar12 * 0x20;
                                }
                                lVar46 = lVar40 + sVar12 * lVar55 + lVar56 + lVar46;
                                lVar48 = lVar52 + lVar55 * sVar9 + lVar48;
                                for (lVar29 = lVar45; lVar29 < lVar44; lVar29 = lVar29 + 1) {
                                  ggml_vec_mad_f32(local_b98,
                                                   (float *)((long)dst->data +
                                                            lVar33 + lVar30 + lVar39),
                                                   (float *)((long)pgVar5->data + lVar48),
                                                   *(float *)((long)pgVar7->data + lVar46));
                                  lVar46 = lVar46 + sVar12;
                                  lVar48 = lVar48 + sVar9;
                                }
                              }
                              lVar53 = lVar53 + 0x20;
                              local_ba8 = local_ba8 + sVar12 * 0x20;
                              local_ba0 = local_ba0 + sVar9 * 0x20;
                              lVar54 = lVar1;
                            }
                          }
                          return;
                        }
                        pcVar36 = "nb0 == sizeof(float)";
                        uVar47 = 0xe19;
                      }
                      else {
                        pcVar36 = "nb00 == sizeof(float)";
                        uVar47 = 0xe16;
                      }
                    }
                    else {
                      pcVar36 = "ne3 % ne03 == 0";
                      uVar47 = 0xe13;
                    }
                  }
                  else {
                    pcVar36 = "ne2 % ne02 == 0";
                    uVar47 = 0xe12;
                  }
                }
                else {
                  pcVar36 = "ne3 == ne13";
                  uVar47 = 0xe10;
                }
              }
              else {
                pcVar36 = "ne2 == ne12";
                uVar47 = 0xe0f;
              }
            }
            else {
              pcVar36 = "ne1 == ne10";
              uVar47 = 0xe0e;
            }
          }
          else {
            pcVar36 = "ne0 == ne00";
            uVar47 = 0xe0d;
          }
        }
        else {
          pcVar36 = "src1->type == GGML_TYPE_F32";
          uVar47 = 0xe08;
        }
      }
      else {
        pcVar36 = "dst->type == GGML_TYPE_F32";
        uVar47 = 0xe06;
      }
      goto LAB_00139173;
    }
    if (uVar60 == 1) {
      uVar47 = 0xef0;
      goto LAB_001392dc;
    }
  }
  uVar47 = 0xef9;
LAB_001392dc:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar47,"fatal error");
}

Assistant:

void ggml_compute_forward_out_prod(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
            {
                ggml_compute_forward_out_prod_q_f32(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ABORT("fatal error"); // todo
                // ggml_compute_forward_out_prod_f16_f32(params, dst);
            }
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_out_prod_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}